

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palobjbase.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CPalObjectBase::Initialize(CPalObjectBase *this,CPalThread *pthr,CObjectAttributes *poa)

{
  PAL_ERROR PVar1;
  void *pvVar2;
  ulong szSize;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0x33);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (poa == (CObjectAttributes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0x34);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d4d70;
  szSize = (ulong)this->m_pot->m_dwImmutableDataSize;
  if (szSize == 0) {
LAB_001d4cf8:
    if (this->m_pot->m_dwProcessLocalDataSize != 0) {
      InternalInitializeCriticalSection(&(this->m_sdlLocalData).m_cs);
      (this->m_sdlLocalData).m_fInitialized = true;
      pvVar2 = InternalMalloc((ulong)this->m_pot->m_dwProcessLocalDataSize);
      this->m_pvLocalData = pvVar2;
      if (pvVar2 == (void *)0x0) goto LAB_001d4d50;
      memset(pvVar2,0,(ulong)this->m_pot->m_dwProcessLocalDataSize);
    }
    if ((poa->sObjectName).m_dwStringLength == 0) {
      PVar1 = 0;
    }
    else {
      PVar1 = CPalString::CopyString(&(this->m_oa).sObjectName,&poa->sObjectName);
    }
  }
  else {
    pvVar2 = InternalMalloc(szSize);
    this->m_pvImmutableData = pvVar2;
    if (pvVar2 != (void *)0x0) {
      memset(pvVar2,0,(ulong)this->m_pot->m_dwImmutableDataSize);
      goto LAB_001d4cf8;
    }
LAB_001d4d50:
    PVar1 = 0xe;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d4d70;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar1;
  }
LAB_001d4d70:
  abort();
}

Assistant:

PAL_ERROR
CPalObjectBase::Initialize(
    CPalThread *pthr,
    CObjectAttributes *poa
    )
{
    PAL_ERROR palError = NO_ERROR;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != poa);

    ENTRY("CPalObjectBase::Initialize"
        "(this = %p, pthr = %p, poa = %p)\n",
        this,
        pthr,
        poa
        );

    if (0 != m_pot->GetImmutableDataSize())
    {
        m_pvImmutableData = InternalMalloc(m_pot->GetImmutableDataSize());
        if (NULL != m_pvImmutableData)
        {
            ZeroMemory(m_pvImmutableData, m_pot->GetImmutableDataSize());
        }
        else
        {
            ERROR("Unable to allocate immutable data\n");
            palError = ERROR_OUTOFMEMORY;
            goto IntializeExit;
        }
    }

    if (0 != m_pot->GetProcessLocalDataSize())
    {
        palError = m_sdlLocalData.Initialize();
        if (NO_ERROR != palError)
        {
            ERROR("Unable to initialize local data lock!\n");
            goto IntializeExit;
        }
        
        m_pvLocalData = InternalMalloc(m_pot->GetProcessLocalDataSize());
        if (NULL != m_pvLocalData)
        {
            ZeroMemory(m_pvLocalData, m_pot->GetProcessLocalDataSize());
        }
        else
        {
            ERROR("Unable to allocate local data\n");
            palError = ERROR_OUTOFMEMORY;
            goto IntializeExit;
        }
    }

    if (0 != poa->sObjectName.GetStringLength())
    {
        palError = m_oa.sObjectName.CopyString(&poa->sObjectName);
    }

IntializeExit:

    LOGEXIT("CPalObjectBase::Initialize returns %d\n", palError);

    return palError;
}